

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O1

void helicsBrokerAddAlias(HelicsBroker broker,char *interfaceName,char *alias,HelicsError *err)

{
  Broker *pBVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  
  pBVar1 = getBroker(broker,err);
  if (pBVar1 == (Broker *)0x0) {
    return;
  }
  if ((interfaceName == (char *)0x0) || (*interfaceName == '\0')) {
    if (err == (HelicsError *)0x0) {
      return;
    }
    err->error_code = -4;
    pcVar4 = "Interface name cannot be empty";
  }
  else {
    if ((alias != (char *)0x0) && (*alias != '\0')) {
      sVar2 = strlen(interfaceName);
      sVar3 = strlen(alias);
      (*pBVar1->_vptr_Broker[0x19])(pBVar1,sVar2,interfaceName,sVar3,alias);
      return;
    }
    if (err == (HelicsError *)0x0) {
      return;
    }
    err->error_code = -4;
    pcVar4 = "Alias cannot be empty";
  }
  err->message = pcVar4;
  return;
}

Assistant:

void helicsBrokerAddAlias(HelicsBroker broker, const char* interfaceName, const char* alias, HelicsError* err)
{
    auto* brk = getBroker(broker, err);
    if (brk == nullptr) {
        return;
    }
    if (interfaceName == nullptr || interfaceName[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidInterfaceName);
        return;
    }
    if (alias == nullptr || alias[0] == '\0') {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidAliasName);
        return;
    }
    try {
        brk->addAlias(interfaceName, alias);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}